

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

TSNode * ts_node__prev_sibling(TSNode *__return_storage_ptr__,TSNode self,_Bool include_anonymous)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  TSNode self_00;
  bool bVar4;
  void *pvVar5;
  bool bVar6;
  _Bool _Var7;
  uint32_t *puVar8;
  uint uVar9;
  bool bVar10;
  TSTree *pTVar11;
  Subtree tree;
  Subtree self_01;
  uint uVar12;
  TSNode child;
  NodeChildIterator iterator;
  Subtree *local_128;
  TSTree *local_120;
  uint local_118;
  Subtree *local_108;
  uint32_t local_e8 [2];
  undefined8 uStackY_e0;
  TSNode local_d8;
  Subtree local_b8;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t local_88 [2];
  undefined8 uStack_80;
  long local_78;
  Subtree local_70;
  Subtree *local_68;
  
  local_68 = (Subtree *)self.id;
  local_70 = *self.id;
  if (((ulong)local_70.ptr & 1) == 0) {
    uVar1 = ((Length *)((long)local_70 + 4))->bytes;
    uVar2 = ((Length *)((long)local_70 + 0x10))->bytes;
  }
  else {
    uVar1 = local_70._2_4_ & 0xff;
    uVar2 = local_70._3_4_ & 0xff;
  }
  if (((ulong)local_70.ptr & 1) == 0) {
    uVar12 = ((local_70.ptr)->size).bytes;
  }
  else {
    uVar12 = local_70._3_4_ & 0xff;
  }
  self_00.context[2] = in_stack_ffffffffffffff58;
  self_00.context._0_8_ = in_stack_ffffffffffffff50;
  self_00.context[3] = in_stack_ffffffffffffff5c;
  self_00.id._0_4_ = in_stack_ffffffffffffff60;
  self_00.id._4_4_ = in_stack_ffffffffffffff64;
  self_00.tree._0_4_ = in_stack_ffffffffffffff68;
  self_00.tree._4_4_ = in_stack_ffffffffffffff6c;
  ts_node_parent(self_00);
  local_88[0] = 0;
  local_88[1] = 0;
  uStack_80 = 0;
  if (local_108 != (Subtree *)0x0) {
    local_78 = (ulong)!include_anonymous * 4 + 0x38;
    bVar4 = false;
    local_120 = (TSTree *)0x0;
    local_128 = (Subtree *)0x0;
    do {
      local_e8[0] = 0;
      local_e8[1] = 0;
      uStackY_e0 = 0;
      local_b8 = (Subtree)local_108->ptr;
      if ((((ulong)local_b8.ptr & 1) != 0) || ((local_b8.ptr)->child_count == 0)) {
        local_b8.ptr = (SubtreeHeapData *)0x0;
        local_118 = 0;
      }
      _Var7 = ts_node_child_iterator_next((NodeChildIterator *)&local_b8.data,&local_d8);
      if (_Var7) {
        bVar10 = false;
        pTVar11 = (TSTree *)0x0;
        local_108 = (Subtree *)0x0;
        do {
          pvVar5 = local_d8.id;
          if ((Subtree *)local_d8.id == local_68) break;
          if (uVar12 + self.context[0] < local_118) {
LAB_0012ad8f:
            if (local_108 != (Subtree *)0x0) {
              local_88[0] = local_e8[0];
              local_88[1] = local_e8[1];
              uStack_80 = uStackY_e0;
              local_128 = local_108;
              local_120 = pTVar11;
              bVar4 = bVar10;
            }
            local_118 = local_d8.context[0];
            local_108 = (Subtree *)local_d8.id;
            goto LAB_0012adcf;
          }
          if (local_118 == uVar12 + self.context[0]) {
            if (uVar2 + uVar1 == 0) {
              self_01.ptr = *local_d8.id;
              _Var7 = ts_subtree_has_trailing_empty_descendant(self_01,local_70);
              if (!_Var7) goto LAB_0012ac60;
            }
            goto LAB_0012ad8f;
          }
          self_01.ptr = *local_d8.id;
LAB_0012ac60:
          if (include_anonymous) {
            if (((ulong)self_01.ptr & 1) == 0) {
              uVar9 = (uint)*(ushort *)&(self_01.ptr)->field_0x2c;
            }
            else {
              uVar9 = (uint)((ulong)self_01.ptr >> 1) & 0x7fffffff;
            }
            bVar6 = true;
            if ((uVar9 & 1) != 0 || local_d8.context[3] != 0) goto LAB_0012ad09;
LAB_0012acea:
            if (((((ulong)self_01.ptr & 1) == 0) && ((self_01.ptr)->child_count != 0)) &&
               (*(int *)((long)&(self_01.ptr)->ref_count + local_78) != 0)) {
              bVar6 = false;
              goto LAB_0012ad09;
            }
          }
          else {
            if (((ulong)self_01.ptr & 1) == 0) {
              if ((*(ushort *)&(self_01.ptr)->field_0x2c & 1) != 0) {
                uVar9 = (uint)(*(ushort *)&(self_01.ptr)->field_0x2c >> 1);
                goto LAB_0012aca9;
              }
            }
            else if (((ulong)self_01.ptr & 2) != 0) {
              uVar9 = (uint)((ulong)self_01.ptr >> 2) & 0x3fffffff;
LAB_0012aca9:
              bVar6 = true;
              if ((uVar9 & 1) != 0) goto LAB_0012ad09;
            }
            if (((local_d8.context[3] == 0) || ((ushort)local_d8.context[3] == 0xfffe)) ||
               ((bVar6 = true, (local_d8.context[3] & 0xffff) != 0xffff &&
                (((byte)(local_d8.tree)->language->symbol_metadata[(ushort)local_d8.context[3]] & 2)
                 == 0)))) goto LAB_0012acea;
LAB_0012ad09:
            bVar10 = bVar6;
            uStackY_e0 = CONCAT44(local_d8.context[3],local_d8.context[2]);
            local_e8[0] = local_d8.context[0];
            local_e8[1] = local_d8.context[1];
            local_108 = (Subtree *)pvVar5;
            pTVar11 = local_d8.tree;
          }
          _Var7 = ts_node_child_iterator_next((NodeChildIterator *)&local_b8.data,&local_d8);
        } while (_Var7);
        if (bVar10) {
          puVar8 = local_e8;
          goto LAB_0012ae02;
        }
        if (local_108 == (Subtree *)0x0) goto LAB_0012ad65;
        local_118 = local_e8[0];
      }
      else {
LAB_0012ad65:
        local_108 = local_128;
        if (bVar4) {
          puVar8 = local_88;
          pTVar11 = local_120;
LAB_0012ae02:
          uVar3 = *(undefined8 *)(puVar8 + 2);
          *(undefined8 *)__return_storage_ptr__->context = *(undefined8 *)puVar8;
          *(undefined8 *)(__return_storage_ptr__->context + 2) = uVar3;
          __return_storage_ptr__->id = local_108;
          __return_storage_ptr__->tree = pTVar11;
          return __return_storage_ptr__;
        }
        local_118 = local_88[0];
      }
LAB_0012adcf:
    } while (local_108 != (Subtree *)0x0);
  }
  __return_storage_ptr__->id = (void *)0x0;
  __return_storage_ptr__->tree = (TSTree *)0x0;
  __return_storage_ptr__->context[0] = 0;
  __return_storage_ptr__->context[1] = 0;
  __return_storage_ptr__->context[2] = 0;
  __return_storage_ptr__->context[3] = 0;
  return __return_storage_ptr__;
}

Assistant:

static inline TSNode ts_node__prev_sibling(TSNode self, bool include_anonymous) {
  Subtree self_subtree = ts_node__subtree(self);
  bool self_is_empty = ts_subtree_total_bytes(self_subtree) == 0;
  uint32_t target_end_byte = ts_node_end_byte(self);

  TSNode node = ts_node_parent(self);
  TSNode earlier_node = ts_node__null();
  bool earlier_node_is_relevant = false;

  while (!ts_node_is_null(node)) {
    TSNode earlier_child = ts_node__null();
    bool earlier_child_is_relevant = false;
    bool found_child_containing_target = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (child.id == self.id) break;
      if (iterator.position.bytes > target_end_byte) {
        found_child_containing_target = true;
        break;
      }

      if (iterator.position.bytes == target_end_byte &&
          (!self_is_empty ||
           ts_subtree_has_trailing_empty_descendant(ts_node__subtree(child), self_subtree))) {
        found_child_containing_target = true;
        break;
      }

      if (ts_node__is_relevant(child, include_anonymous)) {
        earlier_child = child;
        earlier_child_is_relevant = true;
      } else if (ts_node__relevant_child_count(child, include_anonymous) > 0) {
        earlier_child = child;
        earlier_child_is_relevant = false;
      }
    }

    if (found_child_containing_target) {
      if (!ts_node_is_null(earlier_child)) {
        earlier_node = earlier_child;
        earlier_node_is_relevant = earlier_child_is_relevant;
      }
      node = child;
    } else if (earlier_child_is_relevant) {
      return earlier_child;
    } else if (!ts_node_is_null(earlier_child)) {
      node = earlier_child;
    } else if (earlier_node_is_relevant) {
      return earlier_node;
    } else {
      node = earlier_node;
    }
  }

  return ts_node__null();
}